

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

int __thiscall ProString::lastIndexOf(ProString *this,QString *s,int from,CaseSensitivity cs)

{
  qsizetype qVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  qsizetype in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  QStringView QVar2;
  CaseSensitivity in_stack_ffffffffffffff7c;
  QStringView *this_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  qsizetype qVar3;
  storage_type_conflict *psVar4;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_18;
  qVar1 = in_RDI;
  qVar3 = in_RDI;
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (QString *)this_00);
  QVar2 = QStringView::mid((QStringView *)CONCAT44(in_EDX,in_ECX),qVar1,in_RSI);
  psVar4 = (storage_type_conflict *)QVar2.m_size;
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (QString *)this_00);
  QVar2.m_data = psVar4;
  QVar2.m_size = qVar3;
  qVar1 = QStringView::lastIndexOf(this_00,QVar2,in_RDI,in_stack_ffffffffffffff7c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)qVar1;
  }
  __stack_chk_fail();
}

Assistant:

int lastIndexOf(const QString &s, int from = -1, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return toQStringView().lastIndexOf(s, from, cs); }